

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_jpge.cpp
# Opt level: O1

void __thiscall jpge::jpeg_encoder::code_block(jpeg_encoder *this,int component_num)

{
  uint8 *puVar1;
  uint8 *puVar2;
  uint8 *puVar3;
  uint8 *puVar4;
  int *piVar5;
  int *piVar6;
  int *piVar7;
  int *piVar8;
  ulong uVar9;
  undefined1 auVar10 [12];
  undefined1 auVar11 [12];
  undefined1 auVar12 [12];
  undefined1 auVar13 [12];
  undefined1 auVar14 [12];
  undefined1 auVar15 [12];
  undefined1 auVar16 [12];
  undefined1 auVar17 [12];
  undefined1 auVar18 [16];
  long lVar19;
  int iVar20;
  int iVar23;
  int iVar24;
  int iVar25;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  int iVar26;
  int iVar28;
  int iVar29;
  int iVar30;
  undefined1 auVar27 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  int iVar33;
  undefined8 uVar34;
  int iVar37;
  int iVar38;
  int iVar39;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  int iVar40;
  int iVar42;
  int iVar43;
  int iVar44;
  undefined1 auVar41 [16];
  undefined4 uVar48;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  int iVar53;
  int iVar56;
  int iVar57;
  int iVar58;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar66 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar47 [16];
  undefined1 auVar52 [16];
  undefined1 auVar65 [16];
  
  auVar18 = _DAT_001b4780;
  lVar19 = 0xcc;
  do {
    piVar5 = (int *)((long)this->m_mcu_lines + lVar19 + 0x28);
    piVar6 = (int *)((long)this->m_mcu_lines + lVar19 + 8);
    puVar1 = this->m_comp_h_samp + lVar19 + -0x15;
    puVar2 = this->m_comp_h_samp + lVar19 + -5;
    puVar3 = this->m_comp_v_samp + lVar19 + 8;
    puVar4 = this->m_comp_v_samp + lVar19 + 0x18;
    piVar7 = (int *)((long)this->m_mcu_lines + lVar19 + 0x18);
    piVar8 = (int *)((long)this->m_mcu_lines + lVar19 + -8);
    iVar20 = *(int *)(puVar2 + 0xc) + *(int *)puVar1;
    iVar23 = *(int *)(puVar4 + 0xc) + *(int *)puVar3;
    iVar24 = piVar6[3] + *piVar8;
    iVar25 = piVar5[3] + *piVar7;
    auVar61._0_4_ = *(int *)puVar1 - *(int *)(puVar2 + 0xc);
    auVar61._4_4_ = *(int *)puVar3 - *(int *)(puVar4 + 0xc);
    auVar61._8_4_ = *piVar8 - piVar6[3];
    auVar61._12_4_ = *piVar7 - piVar5[3];
    iVar33 = *(int *)(puVar2 + 8) + *(int *)(puVar1 + 4);
    iVar37 = *(int *)(puVar4 + 8) + *(int *)(puVar3 + 4);
    iVar38 = piVar6[2] + piVar8[1];
    iVar39 = piVar5[2] + piVar7[1];
    auVar73._0_4_ = *(int *)(puVar1 + 4) - *(int *)(puVar2 + 8);
    auVar73._4_4_ = *(int *)(puVar3 + 4) - *(int *)(puVar4 + 8);
    auVar73._8_4_ = piVar8[1] - piVar6[2];
    auVar73._12_4_ = piVar7[1] - piVar5[2];
    iVar40 = *(int *)(puVar2 + 4) + *(int *)(puVar1 + 8);
    iVar42 = *(int *)(puVar4 + 4) + *(int *)(puVar3 + 8);
    iVar43 = piVar6[1] + piVar8[2];
    iVar44 = piVar5[1] + piVar7[2];
    auVar66._0_4_ = *(int *)(puVar1 + 8) - *(int *)(puVar2 + 4);
    auVar66._4_4_ = *(int *)(puVar3 + 8) - *(int *)(puVar4 + 4);
    auVar66._8_4_ = piVar8[2] - piVar6[1];
    auVar66._12_4_ = piVar7[2] - piVar5[1];
    iVar53 = *(int *)puVar2 + *(int *)(puVar1 + 0xc);
    iVar56 = *(int *)puVar4 + *(int *)(puVar3 + 0xc);
    iVar57 = *piVar6 + piVar8[3];
    iVar58 = *piVar5 + piVar7[3];
    auVar31._0_4_ = *(int *)(puVar1 + 0xc) - *(int *)puVar2;
    auVar31._4_4_ = *(int *)(puVar3 + 0xc) - *(int *)puVar4;
    auVar31._8_4_ = piVar8[3] - *piVar6;
    auVar31._12_4_ = piVar7[3] - *piVar5;
    iVar26 = iVar20 + iVar53;
    iVar28 = iVar23 + iVar56;
    iVar29 = iVar24 + iVar57;
    iVar30 = iVar25 + iVar58;
    auVar21._0_4_ = iVar20 - iVar53;
    auVar21._4_4_ = iVar23 - iVar56;
    auVar21._8_4_ = iVar24 - iVar57;
    auVar21._12_4_ = iVar25 - iVar58;
    iVar20 = iVar33 + iVar40;
    iVar23 = iVar37 + iVar42;
    iVar24 = iVar38 + iVar43;
    iVar25 = iVar39 + iVar44;
    auVar35._0_4_ = iVar33 - iVar40;
    auVar35._4_4_ = iVar37 - iVar42;
    auVar35._8_4_ = iVar38 - iVar43;
    auVar35._12_4_ = iVar39 - iVar44;
    auVar71._0_4_ = auVar21._0_4_ + auVar35._0_4_;
    auVar71._4_4_ = auVar21._4_4_ + auVar35._4_4_;
    auVar71._8_4_ = auVar21._8_4_ + auVar35._8_4_;
    auVar71._12_4_ = auVar21._12_4_ + auVar35._12_4_;
    auVar71 = pmaddwd(auVar71,_DAT_001b4760);
    auVar21 = pmaddwd(auVar21,_DAT_001b4770);
    auVar35 = pmaddwd(auVar35,auVar18);
    auVar41._0_4_ = auVar73._0_4_ + auVar31._0_4_;
    auVar41._4_4_ = auVar73._4_4_ + auVar31._4_4_;
    auVar41._8_4_ = auVar73._8_4_ + auVar31._8_4_;
    auVar41._12_4_ = auVar73._12_4_ + auVar31._12_4_;
    auVar59._0_4_ = auVar61._0_4_ + auVar66._0_4_;
    auVar59._4_4_ = auVar61._4_4_ + auVar66._4_4_;
    auVar59._8_4_ = auVar61._8_4_ + auVar66._8_4_;
    auVar59._12_4_ = auVar61._12_4_ + auVar66._12_4_;
    auVar67 = pshuflw(in_XMM12,auVar59,0xe8);
    auVar70._0_4_ = auVar59._0_4_ + auVar41._0_4_;
    auVar70._4_4_ = auVar59._4_4_ + auVar41._4_4_;
    auVar70._8_4_ = auVar59._8_4_ + auVar41._8_4_;
    auVar70._12_4_ = auVar59._12_4_ + auVar41._12_4_;
    auVar41 = pshuflw(auVar41,auVar41,0xe8);
    auVar41 = pshufhw(auVar41,auVar41,0xe8);
    auVar49._0_4_ = auVar41._0_4_;
    auVar49._8_4_ = auVar41._8_4_;
    auVar49._12_4_ = auVar41._12_4_;
    auVar49._4_4_ = auVar49._8_4_;
    auVar59 = pshuflw(auVar70,auVar70,0xe8);
    auVar59 = pshufhw(auVar59,auVar59,0xe8);
    uVar48 = auVar59._8_4_;
    uVar9 = CONCAT44(uVar48,uVar48);
    auVar65._0_10_ = (unkuint10)uVar9 << 0x20;
    auVar14._8_2_ = auVar59._10_2_;
    auVar14._0_8_ = uVar9;
    auVar14._10_2_ = auVar41._10_2_;
    auVar65._12_4_ = auVar14._8_4_;
    auVar65._10_2_ = auVar41._8_2_;
    auVar10._4_2_ = auVar59._8_2_;
    auVar10._0_4_ = uVar48;
    auVar10._6_6_ = auVar65._10_6_;
    auVar64._8_8_ = auVar10._4_8_;
    auVar64._6_2_ = auVar41._2_2_;
    auVar64._4_2_ = auVar59._2_2_;
    auVar64._0_2_ = auVar59._0_2_;
    auVar64._2_2_ = auVar41._0_2_;
    auVar69._0_4_ = auVar61._0_4_ + auVar31._0_4_;
    auVar69._4_4_ = auVar61._4_4_ + auVar31._4_4_;
    auVar69._8_4_ = auVar61._8_4_ + auVar31._8_4_;
    auVar69._12_4_ = auVar61._12_4_ + auVar31._12_4_;
    auVar41 = pshufhw(auVar49,auVar67,0xe8);
    auVar15._8_2_ = auVar59._10_2_;
    auVar15._0_8_ = uVar9;
    auVar15._10_2_ = auVar41._10_2_;
    auVar67._12_4_ = auVar15._8_4_;
    auVar67._10_2_ = auVar41._8_2_;
    auVar67._0_10_ = auVar65._0_10_;
    auVar11._4_2_ = auVar59._8_2_;
    auVar11._0_4_ = uVar48;
    auVar11._6_6_ = auVar67._10_6_;
    auVar60._8_8_ = auVar11._4_8_;
    auVar60._6_2_ = auVar41._2_2_;
    auVar60._4_2_ = auVar59._2_2_;
    auVar60._2_2_ = auVar41._0_2_;
    auVar60._0_2_ = auVar64._0_2_;
    auVar68._0_4_ = auVar73._0_4_ + auVar66._0_4_;
    auVar68._4_4_ = auVar73._4_4_ + auVar66._4_4_;
    auVar68._8_4_ = auVar73._8_4_ + auVar66._8_4_;
    auVar68._12_4_ = auVar73._12_4_ + auVar66._12_4_;
    auVar31 = pmaddwd(auVar31,_DAT_001b4790);
    auVar49 = pmaddwd(auVar66,_DAT_001b47a0);
    auVar67 = pmaddwd(auVar73,_DAT_001b47b0);
    auVar41 = pmaddwd(auVar61,_DAT_001b47c0);
    auVar70 = pmaddwd(auVar69,_DAT_001b47d0);
    auVar59 = pmaddwd(auVar68,_DAT_001b47e0);
    auVar66 = pmaddwd(auVar64,_DAT_001b47f0);
    auVar61 = pmaddwd(auVar60,_DAT_001b4800);
    iVar40 = auVar70._0_4_ + 0x400;
    iVar42 = auVar70._4_4_ + 0x400;
    iVar43 = auVar70._8_4_ + 0x400;
    iVar44 = auVar70._12_4_ + 0x400;
    iVar53 = auVar71._0_4_ + 0x400;
    iVar56 = auVar71._4_4_ + 0x400;
    iVar57 = auVar71._8_4_ + 0x400;
    iVar58 = auVar71._12_4_ + 0x400;
    iVar33 = auVar59._0_4_ + 0x400;
    iVar37 = auVar59._4_4_ + 0x400;
    iVar38 = auVar59._8_4_ + 0x400;
    iVar39 = auVar59._12_4_ + 0x400;
    in_XMM12._0_4_ = iVar33 + auVar49._0_4_ + auVar61._0_4_ >> 0xb;
    in_XMM12._4_4_ = iVar37 + auVar49._4_4_ + auVar61._4_4_ >> 0xb;
    in_XMM12._8_4_ = iVar38 + auVar49._8_4_ + auVar61._8_4_ >> 0xb;
    in_XMM12._12_4_ = iVar39 + auVar49._12_4_ + auVar61._12_4_ >> 0xb;
    uVar34 = CONCAT44(in_XMM12._0_4_,(iVar26 - iVar20) * 4);
    *(int *)((long)this->m_mcu_lines + lVar19 + 0x20) = (iVar30 + iVar25) * 4;
    *(int *)((long)this->m_mcu_lines + lVar19 + 0x24) =
         auVar41._12_4_ + iVar44 + auVar61._12_4_ >> 0xb;
    *(int *)((long)this->m_mcu_lines + lVar19 + 0x28) = auVar21._12_4_ + iVar58 >> 0xb;
    *(int *)((long)this->m_mcu_lines + lVar19 + 0x2c) =
         auVar67._12_4_ + iVar39 + auVar66._12_4_ >> 0xb;
    *(int *)((long)this->m_mcu_lines + lVar19 + 0x30) = (iVar30 - iVar25) * 4;
    *(int *)((long)this->m_mcu_lines + lVar19 + 0x34) = in_XMM12._12_4_;
    *(int *)((long)this->m_mcu_lines + lVar19 + 0x38) = iVar58 + auVar35._12_4_ >> 0xb;
    *(int *)((long)this->m_mcu_lines + lVar19 + 0x3c) =
         iVar44 + auVar31._12_4_ + auVar66._12_4_ >> 0xb;
    piVar5 = (int *)((long)this->m_mcu_lines + lVar19 + -8);
    *piVar5 = (iVar29 + iVar24) * 4;
    piVar5[1] = auVar41._8_4_ + iVar43 + auVar61._8_4_ >> 0xb;
    piVar5[2] = auVar21._8_4_ + iVar57 >> 0xb;
    piVar5[3] = auVar67._8_4_ + iVar38 + auVar66._8_4_ >> 0xb;
    piVar5 = (int *)((long)this->m_mcu_lines + lVar19 + 8);
    *piVar5 = (iVar29 - iVar24) * 4;
    piVar5[1] = in_XMM12._8_4_;
    piVar5[2] = iVar57 + auVar35._8_4_ >> 0xb;
    piVar5[3] = iVar43 + auVar31._8_4_ + auVar66._8_4_ >> 0xb;
    *(int *)(this->m_comp_v_samp + lVar19 + 0x10) = (iVar28 + iVar23) * 4;
    *(int *)(this->m_comp_v_samp + lVar19 + 0x14) = auVar41._4_4_ + iVar42 + auVar61._4_4_ >> 0xb;
    *(int *)(this->m_comp_v_samp + lVar19 + 0x18) = auVar21._4_4_ + iVar56 >> 0xb;
    *(int *)((long)this->m_mcu_lines + lVar19 + -0x14) =
         auVar67._4_4_ + iVar37 + auVar66._4_4_ >> 0xb;
    *(int *)((long)this->m_mcu_lines + lVar19 + -0x10) = (iVar28 - iVar23) * 4;
    *(int *)((long)this->m_mcu_lines + lVar19 + -0xc) = in_XMM12._4_4_;
    *(int *)((long)this->m_mcu_lines + lVar19 + -8) = iVar56 + auVar35._4_4_ >> 0xb;
    *(int *)((long)this->m_mcu_lines + lVar19 + -4) = iVar42 + auVar31._4_4_ + auVar66._4_4_ >> 0xb;
    *(ulong *)(this->m_comp_h_samp + lVar19 + -0x15) =
         CONCAT44(auVar41._0_4_ + iVar40 + auVar61._0_4_ >> 0xb,(iVar26 + iVar20) * 4);
    *(ulong *)(this->m_comp_h_samp + lVar19 + -0x15 + 8) =
         CONCAT44(auVar67._0_4_ + iVar33 + auVar66._0_4_ >> 0xb,auVar21._0_4_ + iVar53 >> 0xb);
    *(undefined8 *)(this->m_comp_h_samp + lVar19 + -5) = uVar34;
    *(ulong *)(this->m_comp_h_samp + lVar19 + -5 + 8) =
         CONCAT44(iVar40 + auVar31._0_4_ + auVar66._0_4_ >> 0xb,iVar53 + auVar35._0_4_ >> 0xb);
    lVar19 = lVar19 + 0x80;
  } while (lVar19 != 0x1cc);
  lVar19 = 0x6b;
  do {
    piVar6 = (int *)((long)this + lVar19 * 4 + -0xe0);
    piVar7 = (int *)((long)this + lVar19 * 4 + -0xc0);
    piVar8 = (int *)((long)this + lVar19 * 4 + -0xa0);
    piVar5 = (int *)((long)this + lVar19 * 4 + -0x80);
    puVar2 = this->m_comp_h_samp + lVar19 * 4 + -0x75;
    puVar3 = this->m_comp_h_samp + lVar19 * 4 + -0x55;
    puVar4 = this->m_comp_h_samp + lVar19 * 4 + -0x35;
    puVar1 = this->m_comp_h_samp + lVar19 * 4 + -0x15;
    iVar53 = *(int *)puVar1 + *piVar6;
    iVar56 = *(int *)(puVar1 + 4) + piVar6[1];
    iVar57 = *(int *)(puVar1 + 8) + piVar6[2];
    iVar58 = *(int *)(puVar1 + 0xc) + piVar6[3];
    auVar54._0_4_ = *piVar6 - *(int *)puVar1;
    auVar54._4_4_ = piVar6[1] - *(int *)(puVar1 + 4);
    auVar54._8_4_ = piVar6[2] - *(int *)(puVar1 + 8);
    auVar54._12_4_ = piVar6[3] - *(int *)(puVar1 + 0xc);
    iVar20 = *(int *)puVar4 + *piVar7;
    iVar23 = *(int *)(puVar4 + 4) + piVar7[1];
    iVar24 = *(int *)(puVar4 + 8) + piVar7[2];
    iVar25 = *(int *)(puVar4 + 0xc) + piVar7[3];
    auVar36._0_4_ = *piVar7 - *(int *)puVar4;
    auVar36._4_4_ = piVar7[1] - *(int *)(puVar4 + 4);
    auVar36._8_4_ = piVar7[2] - *(int *)(puVar4 + 8);
    auVar36._12_4_ = piVar7[3] - *(int *)(puVar4 + 0xc);
    iVar33 = *(int *)puVar3 + *piVar8;
    iVar37 = *(int *)(puVar3 + 4) + piVar8[1];
    iVar38 = *(int *)(puVar3 + 8) + piVar8[2];
    iVar39 = *(int *)(puVar3 + 0xc) + piVar8[3];
    auVar27._0_4_ = *piVar8 - *(int *)puVar3;
    auVar27._4_4_ = piVar8[1] - *(int *)(puVar3 + 4);
    auVar27._8_4_ = piVar8[2] - *(int *)(puVar3 + 8);
    auVar27._12_4_ = piVar8[3] - *(int *)(puVar3 + 0xc);
    iVar26 = *(int *)puVar2 + *piVar5;
    iVar28 = *(int *)(puVar2 + 4) + piVar5[1];
    iVar29 = *(int *)(puVar2 + 8) + piVar5[2];
    iVar30 = *(int *)(puVar2 + 0xc) + piVar5[3];
    auVar22._0_4_ = *piVar5 - *(int *)puVar2;
    auVar22._4_4_ = piVar5[1] - *(int *)(puVar2 + 4);
    auVar22._8_4_ = piVar5[2] - *(int *)(puVar2 + 8);
    auVar22._12_4_ = piVar5[3] - *(int *)(puVar2 + 0xc);
    iVar40 = iVar53 + iVar26;
    iVar42 = iVar56 + iVar28;
    iVar43 = iVar57 + iVar29;
    iVar44 = iVar58 + iVar30;
    auVar72._0_4_ = iVar53 - iVar26;
    auVar72._4_4_ = iVar56 - iVar28;
    auVar72._8_4_ = iVar57 - iVar29;
    auVar72._12_4_ = iVar58 - iVar30;
    iVar26 = iVar20 + iVar33;
    iVar28 = iVar23 + iVar37;
    iVar29 = iVar24 + iVar38;
    iVar30 = iVar25 + iVar39;
    auVar32._0_4_ = iVar20 - iVar33;
    auVar32._4_4_ = iVar23 - iVar37;
    auVar32._8_4_ = iVar24 - iVar38;
    auVar32._12_4_ = iVar25 - iVar39;
    auVar45._0_4_ = auVar36._0_4_ + auVar22._0_4_;
    auVar45._4_4_ = auVar36._4_4_ + auVar22._4_4_;
    auVar45._8_4_ = auVar36._8_4_ + auVar22._8_4_;
    auVar45._12_4_ = auVar36._12_4_ + auVar22._12_4_;
    auVar62._0_4_ = auVar54._0_4_ + auVar27._0_4_;
    auVar62._4_4_ = auVar54._4_4_ + auVar27._4_4_;
    auVar62._8_4_ = auVar54._8_4_ + auVar27._8_4_;
    auVar62._12_4_ = auVar54._12_4_ + auVar27._12_4_;
    auVar50._0_4_ = auVar62._0_4_ + auVar45._0_4_;
    auVar50._4_4_ = auVar62._4_4_ + auVar45._4_4_;
    auVar50._8_4_ = auVar62._8_4_ + auVar45._8_4_;
    auVar50._12_4_ = auVar62._12_4_ + auVar45._12_4_;
    auVar21 = pshuflw(auVar45,auVar45,0xe8);
    auVar21 = pshufhw(auVar21,auVar21,0xe8);
    auVar31 = pshuflw(auVar21,auVar50,0xe8);
    auVar31 = pshufhw(auVar31,auVar31,0xe8);
    uVar48 = auVar31._8_4_;
    uVar9 = CONCAT44(uVar48,uVar48);
    auVar47._0_10_ = (unkuint10)uVar9 << 0x20;
    auVar16._8_2_ = auVar31._10_2_;
    auVar16._0_8_ = uVar9;
    auVar16._10_2_ = auVar21._10_2_;
    auVar47._12_4_ = auVar16._8_4_;
    auVar47._10_2_ = auVar21._8_2_;
    auVar12._4_2_ = auVar31._8_2_;
    auVar12._0_4_ = uVar48;
    auVar12._6_6_ = auVar47._10_6_;
    auVar46._8_8_ = auVar12._4_8_;
    auVar46._6_2_ = auVar21._2_2_;
    auVar46._4_2_ = auVar31._2_2_;
    auVar46._0_2_ = auVar31._0_2_;
    auVar46._2_2_ = auVar21._0_2_;
    auVar21 = pshuflw(auVar62,auVar62,0xe8);
    auVar21 = pshufhw(auVar21,auVar21,0xe8);
    auVar17._8_2_ = auVar31._10_2_;
    auVar17._0_8_ = uVar9;
    auVar17._10_2_ = auVar21._10_2_;
    auVar52._12_4_ = auVar17._8_4_;
    auVar52._10_2_ = auVar21._8_2_;
    auVar52._0_10_ = auVar47._0_10_;
    auVar13._4_2_ = auVar31._8_2_;
    auVar13._0_4_ = uVar48;
    auVar13._6_6_ = auVar52._10_6_;
    auVar51._8_8_ = auVar13._4_8_;
    auVar51._6_2_ = auVar21._2_2_;
    auVar51._4_2_ = auVar31._2_2_;
    auVar51._2_2_ = auVar21._0_2_;
    auVar51._0_2_ = auVar46._0_2_;
    piVar5 = (int *)((long)this + lVar19 * 4 + -0xe0);
    *piVar5 = iVar26 + iVar40 + 0x10 >> 5;
    piVar5[1] = iVar28 + iVar42 + 0x10 >> 5;
    piVar5[2] = iVar29 + iVar43 + 0x10 >> 5;
    piVar5[3] = iVar30 + iVar44 + 0x10 >> 5;
    auVar74._0_4_ = auVar54._0_4_ + auVar22._0_4_;
    auVar74._4_4_ = auVar54._4_4_ + auVar22._4_4_;
    auVar74._8_4_ = auVar54._8_4_ + auVar22._8_4_;
    auVar74._12_4_ = auVar54._12_4_ + auVar22._12_4_;
    auVar21 = pmaddwd(auVar54,_DAT_001b47c0);
    auVar31 = pmaddwd(auVar74,_DAT_001b47d0);
    auVar35 = pmaddwd(auVar51,_DAT_001b4800);
    iVar53 = auVar31._0_4_ + 0x20000;
    iVar56 = auVar31._4_4_ + 0x20000;
    iVar57 = auVar31._8_4_ + 0x20000;
    iVar58 = auVar31._12_4_ + 0x20000;
    piVar5 = (int *)((long)this + lVar19 * 4 + -0xc0);
    *piVar5 = auVar21._0_4_ + iVar53 + auVar35._0_4_ >> 0x12;
    piVar5[1] = auVar21._4_4_ + iVar56 + auVar35._4_4_ >> 0x12;
    piVar5[2] = auVar21._8_4_ + iVar57 + auVar35._8_4_ >> 0x12;
    piVar5[3] = auVar21._12_4_ + iVar58 + auVar35._12_4_ >> 0x12;
    auVar55._0_4_ = auVar72._0_4_ + auVar32._0_4_;
    auVar55._4_4_ = auVar72._4_4_ + auVar32._4_4_;
    auVar55._8_4_ = auVar72._8_4_ + auVar32._8_4_;
    auVar55._12_4_ = auVar72._12_4_ + auVar32._12_4_;
    auVar21 = pmaddwd(auVar55,_DAT_001b4760);
    auVar31 = pmaddwd(auVar72,_DAT_001b4770);
    iVar20 = auVar21._0_4_ + 0x20000;
    iVar23 = auVar21._4_4_ + 0x20000;
    iVar24 = auVar21._8_4_ + 0x20000;
    iVar25 = auVar21._12_4_ + 0x20000;
    piVar5 = (int *)((long)this + lVar19 * 4 + -0xa0);
    *piVar5 = auVar31._0_4_ + iVar20 >> 0x12;
    piVar5[1] = auVar31._4_4_ + iVar23 >> 0x12;
    piVar5[2] = auVar31._8_4_ + iVar24 >> 0x12;
    piVar5[3] = auVar31._12_4_ + iVar25 >> 0x12;
    auVar63._0_4_ = auVar36._0_4_ + auVar27._0_4_;
    auVar63._4_4_ = auVar36._4_4_ + auVar27._4_4_;
    auVar63._8_4_ = auVar36._8_4_ + auVar27._8_4_;
    auVar63._12_4_ = auVar36._12_4_ + auVar27._12_4_;
    auVar21 = pmaddwd(auVar36,_DAT_001b47b0);
    auVar41 = pmaddwd(auVar63,_DAT_001b47e0);
    auVar31 = pmaddwd(auVar46,_DAT_001b47f0);
    iVar33 = auVar41._0_4_ + 0x20000;
    iVar37 = auVar41._4_4_ + 0x20000;
    iVar38 = auVar41._8_4_ + 0x20000;
    iVar39 = auVar41._12_4_ + 0x20000;
    piVar5 = (int *)((long)this + lVar19 * 4 + -0x80);
    *piVar5 = auVar21._0_4_ + iVar33 + auVar31._0_4_ >> 0x12;
    piVar5[1] = auVar21._4_4_ + iVar37 + auVar31._4_4_ >> 0x12;
    piVar5[2] = auVar21._8_4_ + iVar38 + auVar31._8_4_ >> 0x12;
    piVar5[3] = auVar21._12_4_ + iVar39 + auVar31._12_4_ >> 0x12;
    puVar1 = this->m_comp_h_samp + lVar19 * 4 + -0x75;
    *(int *)puVar1 = (iVar40 - iVar26) + 0x10 >> 5;
    *(int *)(puVar1 + 4) = (iVar42 - iVar28) + 0x10 >> 5;
    *(int *)(puVar1 + 8) = (iVar43 - iVar29) + 0x10 >> 5;
    *(int *)(puVar1 + 0xc) = (iVar44 - iVar30) + 0x10 >> 5;
    auVar21 = pmaddwd(auVar27,_DAT_001b47a0);
    puVar1 = this->m_comp_h_samp + lVar19 * 4 + -0x55;
    *(int *)puVar1 = iVar33 + auVar21._0_4_ + auVar35._0_4_ >> 0x12;
    *(int *)(puVar1 + 4) = iVar37 + auVar21._4_4_ + auVar35._4_4_ >> 0x12;
    *(int *)(puVar1 + 8) = iVar38 + auVar21._8_4_ + auVar35._8_4_ >> 0x12;
    *(int *)(puVar1 + 0xc) = iVar39 + auVar21._12_4_ + auVar35._12_4_ >> 0x12;
    auVar21 = pmaddwd(auVar32,auVar18);
    puVar1 = this->m_comp_h_samp + lVar19 * 4 + -0x35;
    *(int *)puVar1 = iVar20 + auVar21._0_4_ >> 0x12;
    *(int *)(puVar1 + 4) = iVar23 + auVar21._4_4_ >> 0x12;
    *(int *)(puVar1 + 8) = iVar24 + auVar21._8_4_ >> 0x12;
    *(int *)(puVar1 + 0xc) = iVar25 + auVar21._12_4_ >> 0x12;
    auVar21 = pmaddwd(auVar22,_DAT_001b4790);
    puVar1 = this->m_comp_h_samp + lVar19 * 4 + -0x15;
    *(int *)puVar1 = iVar53 + auVar21._0_4_ + auVar31._0_4_ >> 0x12;
    *(int *)(puVar1 + 4) = iVar56 + auVar21._4_4_ + auVar31._4_4_ >> 0x12;
    *(int *)(puVar1 + 8) = iVar57 + auVar21._8_4_ + auVar31._8_4_ >> 0x12;
    *(int *)(puVar1 + 0xc) = iVar58 + auVar21._12_4_ + auVar31._12_4_ >> 0x12;
    lVar19 = lVar19 + 4;
  } while (lVar19 != 0x73);
  load_quantized_coefficients(this,component_num);
  if (this->m_pass_num == '\x01') {
    code_coefficients_pass_one(this,component_num);
    return;
  }
  code_coefficients_pass_two(this,component_num);
  return;
}

Assistant:

void jpeg_encoder::code_block(int component_num) {
  DCT2D(m_sample_array);
  load_quantized_coefficients(component_num);
  if (m_pass_num == 1)
    code_coefficients_pass_one(component_num);
  else
    code_coefficients_pass_two(component_num);
}